

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderSwitchTests.cpp
# Opt level: O2

void deqp::gles3::Functional::makeSwitchCases
               (TestCaseGroup *group,char *name,char *desc,LineStream *switchBody)

{
  Context *pCVar1;
  char *__rhs;
  TestCaseGroup *pTVar2;
  long lVar3;
  TestNode *pTVar4;
  allocator<char> local_e1;
  TestCaseGroup *local_e0;
  char **local_d8;
  char *local_d0;
  LineStream *local_c8;
  char *local_c0;
  long local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = makeSwitchCases::switchTypeNames;
  local_b8 = 0;
  local_e0 = group;
  local_d0 = desc;
  local_c8 = switchBody;
  local_c0 = name;
  while (local_b8 != 3) {
    pCVar1 = group->m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_c0,&local_e1);
    std::operator+(&local_70,&local_90,"_");
    __rhs = *local_d8;
    std::operator+(&local_50,&local_70,__rhs);
    std::operator+(&local_b0,&local_50,"_vertex");
    pTVar4 = &makeSwitchCase(pCVar1,local_b0._M_dataplus._M_p,local_d0,(SwitchType)local_b8,true,
                             local_c8)->super_TestNode;
    pTVar2 = local_e0;
    tcu::TestNode::addChild((TestNode *)local_e0,pTVar4);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pCVar1 = pTVar2->m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_c0,&local_e1);
    std::operator+(&local_70,&local_90,"_");
    std::operator+(&local_50,&local_70,__rhs);
    std::operator+(&local_b0,&local_50,"_fragment");
    lVar3 = local_b8;
    pTVar4 = &makeSwitchCase(pCVar1,local_b0._M_dataplus._M_p,local_d0,(SwitchType)local_b8,false,
                             local_c8)->super_TestNode;
    group = local_e0;
    tcu::TestNode::addChild((TestNode *)local_e0,pTVar4);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    local_d8 = local_d8 + 1;
    local_b8 = lVar3 + 1;
  }
  return;
}

Assistant:

static void makeSwitchCases (TestCaseGroup* group, const char* name, const char* desc, const LineStream& switchBody)
{
	static const char* switchTypeNames[] = { "static", "uniform", "dynamic" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(switchTypeNames) == SWITCHTYPE_LAST);

	for (int type = 0; type < SWITCHTYPE_LAST; type++)
	{
		group->addChild(makeSwitchCase(group->getContext(), (string(name) + "_" + switchTypeNames[type] + "_vertex").c_str(),	desc, (SwitchType)type, true,	switchBody));
		group->addChild(makeSwitchCase(group->getContext(), (string(name) + "_" + switchTypeNames[type] + "_fragment").c_str(),	desc, (SwitchType)type, false,	switchBody));
	}
}